

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_inotify_poller.cc
# Opt level: O0

optional<InotifyEvent> * __thiscall
RecursiveInotifyPoller::GetNextEvent
          (optional<InotifyEvent> *__return_storage_ptr__,RecursiveInotifyPoller *this)

{
  bool bVar1;
  InotifyEvent *pIVar2;
  char *pcVar3;
  RecursiveInotifyPoller *this_local;
  optional<InotifyEvent> *event;
  
  (*this->ip_->_vptr_InotifyPoller[3])();
  bVar1 = std::experimental::fundamentals_v1::optional::operator_cast_to_bool
                    ((optional *)__return_storage_ptr__);
  if ((bVar1) &&
     (pIVar2 = std::experimental::fundamentals_v1::optional<InotifyEvent>::operator->
                         (__return_storage_ptr__), pIVar2->type == CREATED)) {
    pIVar2 = std::experimental::fundamentals_v1::optional<InotifyEvent>::operator->
                       (__return_storage_ptr__);
    std::experimental::fundamentals_v1::optional<InotifyEvent>::operator->(__return_storage_ptr__);
    std::__cxx11::string::size();
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&pIVar2->path);
    if (*pcVar3 == '/') {
      pIVar2 = std::experimental::fundamentals_v1::optional<InotifyEvent>::operator->
                         (__return_storage_ptr__);
      (*(this->super_InotifyPoller)._vptr_InotifyPoller[2])(this,&pIVar2->path);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::experimental::optional<InotifyEvent>
RecursiveInotifyPoller::GetNextEvent() {
  // Add a new watch in case we've created a new directory.
  std::experimental::optional<InotifyEvent> event = ip_->GetNextEvent();
  if (event && event->type == InotifyEventType::CREATED &&
      event->path[event->path.size() - 1] == '/')
    AddWatch(event->path);
  return event;
}